

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
StringEqual<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs)

{
  SizeType SVar1;
  SizeType SVar2;
  int iVar3;
  Ch *__s1;
  Ch *__s2;
  bool bVar4;
  
  if ((undefined1  [16])((undefined1  [16])this->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
    __assert_fail("IsString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x9a4,
                  "bool rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::StringEqual(const GenericValue<Encoding, SourceAllocator> &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if ((undefined1  [16])((undefined1  [16])rhs->data_ & (undefined1  [16])0x400000000000000) !=
      (undefined1  [16])0x0) {
    SVar1 = GetStringLength(this);
    SVar2 = GetStringLength(rhs);
    if (SVar1 == SVar2) {
      __s1 = GetString(this);
      __s2 = GetString(rhs);
      if (__s1 == __s2) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(__s1,__s2,(ulong)SVar1);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  __assert_fail("rhs.IsString()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x9a5,
                "bool rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::StringEqual(const GenericValue<Encoding, SourceAllocator> &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool IsString() const { return (data_.f.flags & kStringFlag) != 0; }